

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O3

void __thiscall
gulcalc::writemode1output
          (gulcalc *this,int event_id,OASIS_FLOAT tiv,
          vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
          *gilv,bool correlated)

{
  iterator __position;
  gulSampleslevelRec gVar1;
  undefined4 uVar2;
  int iVar3;
  pointer pvVar4;
  vector<gulSampleslevelRec,std::allocator<gulSampleslevelRec>> *this_00;
  _Rb_tree_node_base *p_Var5;
  undefined7 in_register_00000009;
  _Base_ptr p_Var6;
  pointer __k;
  ulong uVar7;
  _Self __tmp;
  gulSampleslevelRec gg;
  map<int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>_>_>
  gxi;
  gulitemSampleslevel local_88;
  int local_74;
  undefined4 local_70;
  OASIS_FLOAT local_6c;
  code *local_68;
  _Rb_tree<int,_std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>_>_>
  local_60;
  
  iVar3 = this->alloc_rule_;
  local_6c = tiv;
  if (iVar3 == 2) {
    setmaxloss(this,gilv);
    iVar3 = this->alloc_rule_;
  }
  local_68 = split_tiv_classic;
  if (iVar3 == 3) {
    local_68 = split_tiv_multiplicative;
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pvVar4 = (gilv->
           super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((gilv->
      super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pvVar4) {
    local_70 = (undefined4)CONCAT71(in_register_00000009,correlated);
    uVar7 = 0;
    local_74 = event_id;
    do {
      if ((uVar7 != (long)this->num_idx_ - 2U) || (uVar7 != (long)this->num_idx_ - 4U)) {
        (*local_68)(local_6c,pvVar4 + uVar7);
        pvVar4 = (gilv->
                 super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      }
      for (__k = pvVar4[uVar7].super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>.
                 _M_impl.super__Vector_impl_data._M_start; uVar2 = local_70, iVar3 = local_74,
          __k != pvVar4[uVar7].super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>.
                 _M_impl.super__Vector_impl_data._M_finish; __k = __k + 1) {
        local_88.event_id = (int)uVar7 - this->num_idx_;
        local_88.item_id = (int)(float)__k->loss;
        this_00 = (vector<gulSampleslevelRec,std::allocator<gulSampleslevelRec>> *)
                  std::
                  map<int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>_>_>
                  ::operator[]((map<int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>_>_>
                                *)&local_60,&__k->item_id);
        __position._M_current = *(gulSampleslevelRec **)(this_00 + 8);
        if (__position._M_current == *(gulSampleslevelRec **)(this_00 + 0x10)) {
          std::vector<gulSampleslevelRec,std::allocator<gulSampleslevelRec>>::
          _M_realloc_insert<gulSampleslevelRec_const&>
                    (this_00,__position,(gulSampleslevelRec *)&local_88);
        }
        else {
          gVar1.loss = (OASIS_FLOAT)local_88.item_id;
          gVar1.sidx = local_88.event_id;
          *__position._M_current = gVar1;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
        }
        pvVar4 = (gilv->
                 super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)(((long)(gilv->
                                    super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 3)
                            * -0x5555555555555555));
    p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_60._M_impl.super__Rb_tree_header) {
      do {
        local_88.event_id = iVar3;
        local_88.item_id = p_Var5[1]._M_color;
        for (p_Var6 = p_Var5[1]._M_parent; p_Var6 != p_Var5[1]._M_left;
            p_Var6 = (_Base_ptr)&p_Var6->_M_parent) {
          local_88.sidx = p_Var6->_M_color;
          local_88.loss = *(OASIS_FLOAT *)&p_Var6->field_0x4;
          if ((char)uVar2 == '\0') {
            itemoutputgul(this,&local_88);
          }
          else {
            correlatedoutputgul(this,&local_88);
          }
        }
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != &local_60._M_impl.super__Rb_tree_header);
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void gulcalc::writemode1output(const int event_id, const OASIS_FLOAT tiv,
			       std::vector<std::vector<gulItemIDLoss>> &gilv,
			       const bool correlated=false) {

	// Set losses for alloc rule where
	// total peril loss = maximum subperil loss
	if (alloc_rule_ == 2) setmaxloss(gilv);

	std::map<int, std::vector<gulSampleslevelRec>> gxi;

    // select tiv split method depending on alloc_rule_
    void (*split_tiv)(std::vector<gulItemIDLoss> &, OASIS_FLOAT);
    if (alloc_rule_==3) split_tiv = &split_tiv_multiplicative;
    else split_tiv = &split_tiv_classic;
	// Check whether the sum of losses per sample exceed TIV
	// If so, split TIV in proportion to losses
	for (size_t i = 0; i < gilv.size(); i++) {

		if ((i != num_idx_ + std_dev_idx) ||
		    (i != num_idx_ + number_of_affected_risk_idx)) {
			split_tiv(gilv[i], tiv);
		}

		auto iter = gilv[i].begin();
		while (iter != gilv[i].end()) {

			gulSampleslevelRec gg;
			gg.sidx = i - num_idx_;
			gg.loss = iter->loss;

			gxi[iter->item_id].push_back(gg);
			iter++;

		}

	}

	// Output all items associated with current coverage ID
	// Output the rows here
	auto iter = gxi.begin();
	while (iter != gxi.end()) {
		gulitemSampleslevel g;
		g.event_id = event_id;
		g.item_id = iter->first;
		auto iter2 = iter->second.begin();
		while (iter2 != iter->second.end()) {
			g.sidx = iter2->sidx;
			g.loss = iter2->loss;
			if (correlated) correlatedoutputgul(g);
			else itemoutputgul(g);
			iter2++;
		}
		iter++;
	}

}